

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multipartExamples.cpp
# Opt level: O2

void modifyDeepChannels<Imath_3_2::half>
               (Array2D<unsigned_int> *sampleCount,
               list<Imf_3_4::Array2D<Imath_3_2::half_*>,_std::allocator<Imf_3_4::Array2D<Imath_3_2::half_*>_>_>
               *channels,half delta)

{
  uint uVar1;
  int x;
  long lVar2;
  _List_node_base *p_Var3;
  int y;
  long lVar4;
  long lVar5;
  
  p_Var3 = (_List_node_base *)channels;
  while (p_Var3 = (((_List_base<Imf_3_4::Array2D<Imath_3_2::half_*>,_std::allocator<Imf_3_4::Array2D<Imath_3_2::half_*>_>_>
                     *)&p_Var3->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var3 != (_List_node_base *)channels) {
    for (lVar4 = 0; lVar4 < (long)p_Var3[1]._M_next; lVar4 = lVar4 + 1) {
      for (lVar2 = 0; lVar2 < (long)p_Var3[1]._M_prev; lVar2 = lVar2 + 1) {
        uVar1 = sampleCount->_data[sampleCount->_sizeY * lVar4 + lVar2];
        for (lVar5 = 0; (ulong)uVar1 * 2 != lVar5; lVar5 = lVar5 + 2) {
          Imath_3_2::half::operator+=
                    ((half *)(*(long *)((long)p_Var3[2]._M_next +
                                       ((long)p_Var3[1]._M_prev * lVar4 + lVar2) * 8) + lVar5),delta
                    );
        }
      }
    }
  }
  return;
}

Assistant:

void
modifyDeepChannels (
    Array2D<uint32_t>& sampleCount, list<Array2D<T*>>& channels, T delta)
{
    //
    // Dummy code modifying each deep pixel by incrementing every sample of each channel by a given delta.
    //

    for (auto i = channels.begin (); i != channels.end (); i++)
    {
        Array2D<T*>& channel = *i;

        for (int y = 0; y < channel.height (); y++)
        {
            for (int x = 0; x < channel.width (); x++)
            {
                uint32_t count = sampleCount[y][x];
                for (uint32_t j = 0; j < count; j++)
                    channel[y][x][j] += delta;
            }
        }
    }
}